

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  N_Vector uu;
  N_Vector up;
  N_Vector p_Var3;
  void *pvVar4;
  UserData paVar5;
  char *funcname;
  bool bVar6;
  void *pvVar7;
  int retval;
  undefined4 local_f0;
  uint local_ec;
  void *local_e8;
  void *local_e0;
  SUNContext ctx;
  void *local_d0;
  undefined8 local_c8;
  N_Vector local_c0;
  int kused;
  UserData local_b0;
  undefined8 local_a8;
  sunrealtype local_a0;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  long nps;
  long npe;
  long nreLS;
  long nre;
  long nje;
  long nni;
  long nst;
  sunrealtype hused;
  long nli;
  
  iVar1 = 0;
  if (1 < argc) {
    iVar1 = atoi(argv[1]);
  }
  retval = SUNContext_Create(0,&ctx);
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    uu = (N_Vector)N_VNew_Serial(100,ctx);
    iVar2 = check_retval(uu,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      up = (N_Vector)N_VClone(uu);
      iVar2 = check_retval(up,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        p_Var3 = (N_Vector)N_VClone(uu);
        iVar2 = check_retval(p_Var3,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          pvVar4 = (void *)N_VClone(uu);
          iVar2 = check_retval(pvVar4,"N_VNew_Serial",0);
          if (iVar2 == 0) {
            local_c0 = p_Var3;
            paVar5 = (UserData)malloc(0x20);
            paVar5->pp = (N_Vector)0x0;
            iVar2 = check_retval(paVar5,"malloc",2);
            if (iVar2 == 0) {
              paVar5->mm = 10;
              paVar5->dx = 0.1111111111111111;
              paVar5->coeff = 81.0;
              p_Var3 = (N_Vector)N_VClone(uu);
              paVar5->pp = p_Var3;
              iVar2 = check_retval(p_Var3,"N_VNew_Serial",0);
              if (iVar2 == 0) {
                SetInitialProfile(paVar5,uu,up,local_c0);
                N_VConst(0x3ff0000000000000,pvVar4);
                local_e0 = (void *)IDACreate(ctx);
                local_d0 = local_e0;
                iVar2 = check_retval(local_e0,"IDACreate",0);
                if (iVar2 == 0) {
                  retval = IDASetUserData(local_e0,paVar5);
                  iVar2 = check_retval(&retval,"IDASetUserData",1);
                  if (iVar2 == 0) {
                    retval = IDASetConstraints(local_e0,pvVar4);
                    iVar2 = check_retval(&retval,"IDASetConstraints",1);
                    if (iVar2 == 0) {
                      N_VDestroy(pvVar4);
                      retval = IDAInit(0,local_e0,resHeat,uu,up);
                      iVar2 = check_retval(&retval,"IDAInit",1);
                      if (iVar2 == 0) {
                        local_c8 = 0;
                        retval = IDASStolerances(0,0x3f50624dd2f1a9fc,local_e0);
                        iVar2 = check_retval(&retval,"IDASStolerances",1);
                        if (iVar2 == 0) {
                          if (iVar1 == 2) {
                            local_c8 = 0xbff0000000000000;
                          }
                          if (iVar1 == 1) {
                            local_c8 = 0x4024000000000000;
                          }
                          local_ec = 0;
                          local_e8 = (void *)0x0;
                          local_b0 = paVar5;
                          while( true ) {
                            if (local_ec == 0) {
                              SUNLinSolFree(local_e8);
                              printf(" -------");
                              puts(" \n| SPGMR |");
                              puts(" -------");
                              local_e8 = (void *)SUNLinSol_SPGMR(uu,1,0,ctx);
                              funcname = "SUNLinSol_SPGMR";
                            }
                            else {
                              if (local_ec == 3) {
                                IDAFree(&local_d0);
                                SUNLinSolFree(local_e8);
                                N_VDestroy(uu);
                                N_VDestroy(up);
                                N_VDestroy(local_c0);
                                paVar5 = local_b0;
                                N_VDestroy(local_b0->pp);
                                free(paVar5);
                                SUNContext_Free(&ctx);
                                return 0;
                              }
                              SetInitialProfile(local_b0,uu,up,local_c0);
                              retval = IDAReInit(0,local_e0,uu,up);
                              iVar1 = check_retval(&retval,"IDAReInit",1);
                              if (iVar1 != 0) {
                                return 1;
                              }
                              SUNLinSolFree(local_e8);
                              if (local_ec == 2) {
                                printf(" ---------");
                                puts(" \n| SPTFQMR |");
                                puts(" ---------");
                                local_e8 = (void *)SUNLinSol_SPTFQMR(uu,1,0,ctx);
                                funcname = "SUNLinSol_SPTFQMR";
                              }
                              else {
                                printf(" -------");
                                puts(" \n| SPBCGS |");
                                puts(" -------");
                                local_e8 = (void *)SUNLinSol_SPBCGS(uu,1,0,ctx);
                                funcname = "SUNLinSol_SPBCGS";
                              }
                            }
                            iVar1 = check_retval(local_e8,funcname,0);
                            pvVar4 = local_d0;
                            if (iVar1 != 0) {
                              return 1;
                            }
                            retval = IDASetLinearSolver(local_d0,local_e8,0);
                            iVar1 = check_retval(&retval,"IDASetLinearSolver",1);
                            if (iVar1 != 0) break;
                            retval = IDASetPreconditioner(pvVar4,PsetupHeat,PsolveHeat);
                            iVar1 = check_retval(&retval,"IDASetPreconditioner",1);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            retval = IDASetLSNormFactor(local_c8,pvVar4);
                            iVar1 = check_retval(&retval,"IDASetLSNormFactor",1);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            puts("\nidaKrylovDemo_ls: Heat equation, serial example problem for IDA"
                                );
                            puts("               Discretized heat equation on 2D unit square.");
                            printf("               Zero boundary conditions,");
                            puts(" polynomial initial conditions.");
                            printf("         Mesh dimensions: %d x %d",10);
                            printf("       Total system size: %d\n\n",100);
                            printf("Tolerance parameters:  rtol = %g   atol = %g\n",0,
                                   0x3f50624dd2f1a9fc);
                            puts("Constraints set to force all solution components >= 0. ");
                            puts(&DAT_0010471c + *(int *)(&DAT_0010471c + (ulong)local_ec * 4));
                            puts("\n   Output Summary (umax = max-norm of solution) \n");
                            puts(
                                "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps"
                                );
                            puts(
                                "----------------------------------------------------------------------"
                                );
                            iVar1 = 0xb;
                            pvVar7 = (void *)0x3f847ae147ae147b;
                            while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
                              local_e0 = pvVar7;
                              retval = IDASolve(pvVar4,&tret,uu,up,1);
                              iVar2 = check_retval(&retval,"IDASolve",1);
                              pvVar4 = local_d0;
                              if (iVar2 != 0) {
                                return 1;
                              }
                              local_a0 = tret;
                              local_a8 = N_VMaxNorm(uu);
                              local_f0 = IDAGetLastOrder(pvVar4,&kused);
                              check_retval(&local_f0,"IDAGetLastOrder",1);
                              local_f0 = IDAGetNumSteps(pvVar4,&nst);
                              check_retval(&local_f0,"IDAGetNumSteps",1);
                              local_f0 = IDAGetNumNonlinSolvIters(pvVar4,&nni);
                              check_retval(&local_f0,"IDAGetNumNonlinSolvIters",1);
                              local_f0 = IDAGetNumResEvals(pvVar4,&nre);
                              check_retval(&local_f0,"IDAGetNumResEvals",1);
                              local_f0 = IDAGetLastStep(pvVar4,&hused);
                              check_retval(&local_f0,"IDAGetLastStep",1);
                              local_f0 = IDAGetNumJtimesEvals(pvVar4,&nje);
                              check_retval(&local_f0,"IDAGetNumJtimesEvals",1);
                              local_f0 = IDAGetNumLinIters(pvVar4,&nli);
                              check_retval(&local_f0,"IDAGetNumLinIters",1);
                              local_f0 = IDAGetNumLinResEvals(pvVar4,&nreLS);
                              check_retval(&local_f0,"IDAGetNumLinResEvals",1);
                              local_f0 = IDAGetNumPrecEvals(pvVar4,&npe);
                              check_retval(&local_f0,"IDAGetNumPrecEvals",1);
                              local_f0 = IDAGetNumPrecSolves(pvVar4,&nps);
                              check_retval(&local_f0,"IDAGetNumPrecSolves",1);
                              printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n"
                                     ,local_a0,local_a8,hused,(ulong)(uint)kused,nst,nni,nje,nre,
                                     nreLS,npe,nps);
                              pvVar7 = (void *)((double)local_e0 + (double)local_e0);
                            }
                            retval = IDAGetNumErrTestFails(pvVar4,&netf);
                            check_retval(&retval,"IDAGetNumErrTestFails",1);
                            pvVar4 = local_d0;
                            retval = IDAGetNumNonlinSolvConvFails(local_d0,&ncfn);
                            check_retval(&retval,"IDAGetNumNonlinSolvConvFails",1);
                            local_e0 = pvVar4;
                            retval = IDAGetNumLinConvFails(pvVar4,&ncfl);
                            check_retval(&retval,"IDAGetNumLinConvFails",1);
                            printf("\nError test failures            = %ld\n",netf);
                            printf("Nonlinear convergence failures = %ld\n",ncfn);
                            printf("Linear convergence failures    = %ld\n",ncfl);
                            if (local_ec != 2) {
                              puts(
                                  "\n======================================================================\n"
                                  );
                            }
                            local_ec = local_ec + 1;
                          }
                          return 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout, linsolver;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  SUNContext ctx;

  mem         = NULL;
  data        = NULL;
  uu          = NULL;
  up          = NULL;
  constraints = NULL;
  res         = NULL;
  LS          = NULL;
  nrmfactor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* START: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 3; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize uu, up. */
      SetInitialProfile(data, uu, up, res);

      /* Re-initialize IDA */
      retval = IDAReInit(mem, t0, uu, up);
      if (check_retval(&retval, "IDAReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Specify preconditioner */
    retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
    if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = IDASetLSNormFactor(mem, nrmfac);
    if (check_retval(&retval, "IDASetLSNormFactor", 1)) { return (1); }

    /* Print output heading. */
    PrintHeader(rtol, atol, linsolver);

    /* Print output table heading, and initial line of table. */

    printf("\n   Output Summary (umax = max-norm of solution) \n\n");
    printf("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe "
           "nps\n");
    printf("-------------------------------------------------------------------"
           "---\n");

    /* Loop over output times, call IDASolve, and print results. */

    for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
    {
      retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
      if (check_retval(&retval, "IDASolve", 1)) { return (1); }
      PrintOutput(mem, tret, uu, linsolver);
    }

    /* Print remaining counters. */
    retval = IDAGetNumErrTestFails(mem, &netf);
    check_retval(&retval, "IDAGetNumErrTestFails", 1);

    retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
    check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

    retval = IDAGetNumLinConvFails(mem, &ncfl);
    check_retval(&retval, "IDAGetNumLinConvFails", 1);

    printf("\nError test failures            = %ld\n", netf);
    printf("Nonlinear convergence failures = %ld\n", ncfn);
    printf("Linear convergence failures    = %ld\n", ncfl);

    if (linsolver < 2)
    {
      printf("\n==============================================================="
             "=======\n\n");
    }

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}